

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

STRING_HANDLE STRING_clone(STRING_HANDLE handle)

{
  size_t sVar1;
  char *pcVar2;
  LOGGER_LOG p_Var3;
  size_t local_38;
  LOGGER_LOG l;
  size_t sourceLen;
  STRING *source;
  STRING *result;
  STRING_HANDLE handle_local;
  
  if (handle == (STRING_HANDLE)0x0) {
    source = (STRING *)0x0;
  }
  else {
    source = (STRING *)malloc(8);
    if (source != (STRING_HANDLE)0x0) {
      sVar1 = strlen(handle->s);
      if (sVar1 < 0xfffffffffffffffe) {
        local_38 = strlen(handle->s);
        local_38 = local_38 + 1;
      }
      else {
        local_38 = 0xffffffffffffffff;
      }
      if (local_38 != 0xffffffffffffffff) {
        pcVar2 = (char *)malloc(local_38);
        source->s = pcVar2;
        if (pcVar2 != (char *)0x0) {
          memcpy(source->s,handle->s,local_38);
          return source;
        }
      }
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/strings.c"
                  ,"STRING_clone",0x42,1,"Failure allocating clone value. size=%zu",local_38);
      }
      free(source);
      source = (STRING *)0x0;
    }
  }
  return source;
}

Assistant:

STRING_HANDLE STRING_clone(STRING_HANDLE handle)
{
    STRING* result;
    /*Codes_SRS_STRING_02_002: [If parameter handle is NULL then STRING_clone shall return NULL.]*/
    if (handle == NULL)
    {
        result = NULL;
    }
    else
    {
        /*Codes_SRS_STRING_02_003: [If STRING_clone fails for any reason, it shall return NULL.] */
        if ((result = (STRING*)malloc(sizeof(STRING))) != NULL)
        {
            STRING* source = (STRING*)handle;
            /*Codes_SRS_STRING_02_003: [If STRING_clone fails for any reason, it shall return NULL.] */
            size_t sourceLen = safe_add_size_t(strlen(source->s), 1);

            if (sourceLen == SIZE_MAX ||
                (result->s = (char*)malloc(sourceLen)) == NULL)
            {
                LogError("Failure allocating clone value. size=%zu", sourceLen);
                free(result);
                result = NULL;
            }
            else
            {
                (void)memcpy(result->s, source->s, sourceLen);
            }
        }
        else
        {
            /*not much to do, result is NULL from malloc*/
        }
    }
    return (STRING_HANDLE)result;
}